

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O3

String * __thiscall Json::toHex16Bit_abi_cxx11_(String *__return_storage_ptr__,Json *this,uint x)

{
  char cVar1;
  undefined1 uVar2;
  String *pSVar3;
  ulong uVar4;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,'\x04');
  uVar4 = (ulong)((uint)((ulong)this >> 8) & 0xff);
  cVar1 = hex2[uVar4 * 2 + 1];
  *(__return_storage_ptr__->_M_dataplus)._M_p = hex2[uVar4 * 2];
  (__return_storage_ptr__->_M_dataplus)._M_p[1] = cVar1;
  uVar4 = (ulong)((uint)this & 0xff);
  uVar2 = hex2[uVar4 * 2 + 1];
  (__return_storage_ptr__->_M_dataplus)._M_p[2] = hex2[uVar4 * 2];
  pSVar3 = (String *)(__return_storage_ptr__->_M_dataplus)._M_p;
  *(undefined1 *)((long)&(pSVar3->_M_dataplus)._M_p + 3) = uVar2;
  return pSVar3;
}

Assistant:

static String toHex16Bit(unsigned int x) {
  const unsigned int hi = (x >> 8) & 0xff;
  const unsigned int lo = x & 0xff;
  String result(4, ' ');
  result[0] = hex2[2 * hi];
  result[1] = hex2[2 * hi + 1];
  result[2] = hex2[2 * lo];
  result[3] = hex2[2 * lo + 1];
  return result;
}